

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O2

void __thiscall
leveldb::CorruptionTest::Check(CorruptionTest *this,int min_expected,int max_expected)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar5;
  uint uVar6;
  Slice SVar7;
  uint local_b8;
  int correct;
  Slice in;
  Slice local_a0;
  ulong local_90;
  ulong local_88;
  Slice local_80;
  uint local_70;
  uint local_6c;
  int max_expected_local;
  int min_expected_local;
  uint64_t key;
  CorruptionTest *local_58;
  string value_space;
  long *plVar4;
  
  correct = 0;
  value_space._M_dataplus._M_p = (pointer)&value_space.field_2;
  value_space._M_string_length = 0;
  value_space.field_2._M_local_buf[0] = '\0';
  in.size_ = 0;
  in.data_ = (char *)0x100;
  local_70 = min_expected;
  local_6c = max_expected;
  max_expected_local = max_expected;
  min_expected_local = min_expected;
  local_58 = this;
  iVar3 = (*this->db_->_vptr_DB[6])(this->db_,&in);
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  (**(code **)(*plVar4 + 0x18))(plVar4);
  local_b8 = 0;
  pcVar5 = "";
  local_88 = 0;
  uVar6 = 0;
  local_90 = 0;
  iVar3 = 0;
  while( true ) {
    cVar1 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (cVar1 == '\0') break;
    SVar7 = (Slice)(**(code **)(*plVar4 + 0x40))(plVar4);
    local_a0.data_ = "";
    local_a0.size_ = 0;
    in = SVar7;
    bVar2 = operator==(&in,&local_a0);
    if (!bVar2) {
      local_80.size_ = 1;
      local_80.data_ = "~";
      bVar2 = operator==(&in,&local_80);
      if (!bVar2) {
        bVar2 = ConsumeDecimalNumber(&in,&key);
        if (((bVar2) && (in.size_ == 0)) && ((ulong)(long)iVar3 <= CONCAT44(key._4_4_,(int)key))) {
          local_88 = (ulong)(uint)((int)local_88 + ((int)key - iVar3));
          iVar3 = (int)key + 1;
          local_a0 = (Slice)(**(code **)(*plVar4 + 0x48))(plVar4);
          local_80 = Value(local_58,(int)key,&value_space);
          bVar2 = operator!=(&local_a0,&local_80);
          if (bVar2) {
            local_90 = (ulong)((int)local_90 + 1);
          }
          else {
            local_b8 = local_b8 + 1;
            correct = local_b8;
          }
        }
        else {
          uVar6 = uVar6 + 1;
        }
      }
    }
    (**(code **)(*plVar4 + 0x30))(plVar4);
  }
  (**(code **)(*plVar4 + 8))(plVar4);
  fprintf(_stderr,"expected=%d..%d; got=%d; bad_keys=%d; bad_values=%d; missed=%d\n",(ulong)local_70
          ,(ulong)local_6c,(ulong)local_b8,(ulong)uVar6,local_90,local_88);
  testing::internal::CmpHelperLE<int,int>
            ((internal *)&in,"min_expected","correct",&min_expected_local,&correct);
  if ((char)in.data_ == '\0') {
    testing::Message::Message((Message *)&local_a0);
    if (in.size_ != 0) {
      pcVar5 = *(char **)in.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/corruption_test.cc"
               ,0x6d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((long *)local_a0.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_a0.data_ + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&in.size_);
    testing::internal::CmpHelperGE<int,int>
              ((internal *)&in,"max_expected","correct",&max_expected_local,&correct);
    if ((char)in.data_ == '\0') {
      testing::Message::Message((Message *)&local_a0);
      if (in.size_ == 0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)in.size_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/corruption_test.cc"
                 ,0x6e,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
      if ((long *)local_a0.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_a0.data_ + 8))();
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&in.size_);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void Check(int min_expected, int max_expected) {
    int next_expected = 0;
    int missed = 0;
    int bad_keys = 0;
    int bad_values = 0;
    int correct = 0;
    std::string value_space;
    Iterator* iter = db_->NewIterator(ReadOptions());
    for (iter->SeekToFirst(); iter->Valid(); iter->Next()) {
      uint64_t key;
      Slice in(iter->key());
      if (in == "" || in == "~") {
        // Ignore boundary keys.
        continue;
      }
      if (!ConsumeDecimalNumber(&in, &key) || !in.empty() ||
          key < next_expected) {
        bad_keys++;
        continue;
      }
      missed += (key - next_expected);
      next_expected = key + 1;
      if (iter->value() != Value(key, &value_space)) {
        bad_values++;
      } else {
        correct++;
      }
    }
    delete iter;

    std::fprintf(
        stderr,
        "expected=%d..%d; got=%d; bad_keys=%d; bad_values=%d; missed=%d\n",
        min_expected, max_expected, correct, bad_keys, bad_values, missed);
    ASSERT_LE(min_expected, correct);
    ASSERT_GE(max_expected, correct);
  }